

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::~SAT(SAT *this)

{
  uint i_1;
  uint i;
  ulong uVar1;
  
  (this->super_Branching)._vptr_Branching = (_func_int **)&PTR_finished_001f3868;
  for (uVar1 = 0; uVar1 < (this->clauses).sz; uVar1 = uVar1 + 1) {
    free((this->clauses).data[uVar1]);
  }
  for (uVar1 = 0; uVar1 < (this->learnts).sz; uVar1 = uVar1 + 1) {
    free((this->learnts).data[uVar1]);
  }
  vec<double>::~vec(&this->learnt_len_occ);
  vec<bool>::~vec(&this->polarity);
  Heap<SAT::VarOrderLt>::~Heap(&this->order_heap);
  vec<double>::~vec(&this->activity);
  vec<IntVar_*>::~vec(&this->min_vars);
  vec<Lit>::~vec(&this->analyze_toclear);
  vec<Lit>::~vec(&this->analyze_stack);
  vec<int>::~vec(&this->ivseen_toclear);
  vec<bool>::~vec(&this->ivseen);
  vec<char>::~vec(&this->seen);
  vec<int>::~vec(&this->out_learnt_level);
  vec<Lit>::~vec(&this->out_learnt);
  vec<vec<Clause_*>_>::~vec(&this->rtrail);
  vec<int>::~vec(&this->qhead);
  vec<vec<Lit>_>::~vec(&this->trail);
  vec<int>::~vec(&this->num_used);
  vec<int>::~vec(&this->var_free_list);
  vec<LitFlags>::~vec(&this->flags);
  vec<int>::~vec(&this->trailpos);
  vec<Reason>::~vec(&this->reason);
  vec<signed_char>::~vec(&this->assigns);
  vec<vec<WatchElem>_>::~vec(&this->watches);
  vec<ChannelInfo>::~vec(&this->c_info);
  vec<Clause_*>::~vec(&this->learnts);
  vec<Clause_*>::~vec(&this->clauses);
  return;
}

Assistant:

SAT::~SAT() {
	for (unsigned int i = 0; i < clauses.size(); i++) {
		free(clauses[i]);
	}
	for (unsigned int i = 0; i < learnts.size(); i++) {
		free(learnts[i]);
	}
}